

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Belief::InnerProduct(Belief *this,VectorSet *v,vector<bool,_std::allocator<bool>_> *mask)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *pvVar1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_01;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar2;
  const_reference pvVar3;
  reference pvVar4;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint s;
  uint k;
  double x;
  vector<double,_std::allocator<double>_> *values;
  value_type j;
  allocator_type *in_stack_ffffffffffffff58;
  value_type_conflict3 *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size1(in_RDX);
  std::allocator<double>::allocator((allocator<double> *)0x9b9c8f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
             ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<double>::~allocator((allocator<double> *)0x9b9cba);
  local_54 = 0;
  while( true ) {
    this_00 = (vector<bool,_std::allocator<bool>_> *)(ulong)local_54;
    pvVar1 = (vector<bool,_std::allocator<bool>_> *)
             boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::size1(in_RDX);
    if (this_00 == pvVar1) break;
    in_stack_ffffffffffffff6f =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   (this_00,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if ((bool)in_stack_ffffffffffffff6f) {
      local_50 = 0.0;
      local_58 = 0;
      while( true ) {
        this_01 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(ulong)local_58;
        pmVar2 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x10));
        if (this_01 == pmVar2) break;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x10),
                            (ulong)local_58);
        j = *pvVar3;
        in_stack_ffffffffffffff58 =
             (allocator_type *)
             boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::operator()(this_01,(size_type)in_stack_ffffffffffffff58,(size_type)j);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = j;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(double *)in_stack_ffffffffffffff58;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_50;
        auVar5 = vfmadd213sd_fma(auVar5,auVar6,auVar7);
        local_50 = auVar5._0_8_;
        local_58 = local_58 + 1;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_54);
      *pvVar4 = local_50;
    }
    local_54 = local_54 + 1;
  }
  return in_RDI;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v,
                                    const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(unsigned int s=0; s!=_m_b.size(); ++s)
                x+=_m_b[s]*v(k,s);
            values[k]=x;
        }
    }

    return(values);
}